

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skeleton.cc
# Opt level: O2

void __thiscall re2c::Skeleton::~Skeleton(Skeleton *this)

{
  Node *pNVar1;
  path_t *ppVar2;
  long lVar3;
  
  pNVar1 = this->nodes;
  if (pNVar1 != (Node *)0x0) {
    ppVar2 = pNVar1[-1].suffix;
    if (ppVar2 != (path_t *)0x0) {
      lVar3 = (long)ppVar2 * 0xb0;
      do {
        Node::~Node((Node *)(&pNVar1[-1].arcs._M_t._M_impl.field_0x0 + lVar3));
        lVar3 = lVar3 + -0xb0;
      } while (lVar3 != 0);
    }
    operator_delete__(&pNVar1[-1].suffix,(long)ppVar2 * 0xb0 | 8);
  }
  std::
  _Rb_tree<re2c::rule_rank_t,_std::pair<const_re2c::rule_rank_t,_re2c::rule_info_t>,_std::_Select1st<std::pair<const_re2c::rule_rank_t,_re2c::rule_info_t>_>,_std::less<re2c::rule_rank_t>,_std::allocator<std::pair<const_re2c::rule_rank_t,_re2c::rule_info_t>_>_>
  ::~_Rb_tree(&(this->rules)._M_t);
  std::__cxx11::string::~string((string *)&this->cond);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

Skeleton::~Skeleton ()
{
	delete [] nodes;
}